

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O3

Entry * __thiscall
kj::
Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>_>
::release(Entry *__return_storage_ptr__,
         Table<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry,_kj::HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>_>
         *this,Entry *row)

{
  Maybe<kj::Promise<void>_> *other;
  size_t oldPos;
  Own<capnp::ClientHook,_std::nullptr_t> *pOVar1;
  Disposer *pDVar2;
  ClientHook *pCVar3;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2 aVar4;
  VineInfo *pVVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  HashIndex<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>
  *indexObj;
  size_t pos;
  Entry *pEVar9;
  ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
  table;
  ArrayPtr<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
  table_00;
  
  pEVar9 = (this->rows).builder.ptr;
  pos = (long)row - (long)pEVar9 >> 6;
  table.size_ = (long)(this->rows).builder.pos - (long)pEVar9 >> 6;
  table.ptr = pEVar9;
  HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>
  ::
  erase<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry,unsigned_int&>
            ((HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>
              *)&this->indexes,table,pos,&row->key);
  __return_storage_ptr__->key = row->key;
  (__return_storage_ptr__->value).refcount = (row->value).refcount;
  (__return_storage_ptr__->value).canonical = (row->value).canonical;
  pCVar3 = (row->value).clientHook.ptr;
  (__return_storage_ptr__->value).clientHook.disposer = (row->value).clientHook.disposer;
  (__return_storage_ptr__->value).clientHook.ptr = pCVar3;
  (row->value).clientHook.ptr = (ClientHook *)0x0;
  other = &(row->value).resolveOp;
  Maybe<kj::Promise<void>_>::Maybe(&(__return_storage_ptr__->value).resolveOp,other);
  pVVar5 = (row->value).vineInfo.ptr.ptr;
  (__return_storage_ptr__->value).vineInfo.ptr.disposer = (row->value).vineInfo.ptr.disposer;
  (__return_storage_ptr__->value).vineInfo.ptr.ptr = pVVar5;
  (row->value).vineInfo.ptr.ptr = (VineInfo *)0x0;
  pEVar9 = (this->rows).builder.ptr;
  table_00.size_ = (long)(this->rows).builder.pos - (long)pEVar9 >> 6;
  oldPos = table_00.size_ - 1;
  if (pos != oldPos) {
    table_00.ptr = pEVar9;
    HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>
    ::
    move<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry,unsigned_int&>
              ((HashIndex<kj::HashMap<unsigned_int,capnp::_::RpcSystemBase::RpcConnectionState::Export>::Callbacks>
                *)&this->indexes,table_00,oldPos,pos,&pEVar9[oldPos].key);
    pEVar9 = (this->rows).builder.ptr;
    row->key = pEVar9[oldPos].key;
    (row->value).canonical = pEVar9[oldPos].value.canonical;
    (row->value).refcount = pEVar9[oldPos].value.refcount;
    pDVar2 = (row->value).clientHook.disposer;
    pCVar3 = (row->value).clientHook.ptr;
    pOVar1 = &pEVar9[oldPos].value.clientHook;
    uVar6 = *(undefined4 *)((long)&pOVar1->disposer + 4);
    uVar7 = *(undefined4 *)&pOVar1->ptr;
    uVar8 = *(undefined4 *)((long)&pOVar1->ptr + 4);
    *(undefined4 *)&(row->value).clientHook.disposer = *(undefined4 *)&pOVar1->disposer;
    *(undefined4 *)((long)&(row->value).clientHook.disposer + 4) = uVar6;
    *(undefined4 *)&(row->value).clientHook.ptr = uVar7;
    *(undefined4 *)((long)&(row->value).clientHook.ptr + 4) = uVar8;
    pEVar9[oldPos].value.clientHook.ptr = (ClientHook *)0x0;
    if (pCVar3 != (ClientHook *)0x0) {
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(_func_int *)
                        ((long)&pCVar3->_vptr_ClientHook + (long)pCVar3->_vptr_ClientHook[-2]));
    }
    pEVar9 = pEVar9 + oldPos;
    if (pEVar9 != row) {
      if ((other->ptr).isSet == true) {
        (row->value).resolveOp.ptr.isSet = false;
        aVar4 = (row->value).resolveOp.ptr.field_1;
        if (aVar4 != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0) {
          (row->value).resolveOp.ptr.field_1 =
               (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
          kj::_::PromiseDisposer::dispose((PromiseArenaMember *)aVar4);
        }
      }
      if ((pEVar9->value).resolveOp.ptr.isSet == true) {
        (row->value).resolveOp.ptr.field_1 = (pEVar9->value).resolveOp.ptr.field_1;
        (pEVar9->value).resolveOp.ptr.field_1 =
             (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
        (row->value).resolveOp.ptr.isSet = true;
      }
    }
    if ((pEVar9->value).resolveOp.ptr.isSet == true) {
      (pEVar9->value).resolveOp.ptr.isSet = false;
      aVar4 = (pEVar9->value).resolveOp.ptr.field_1;
      if (aVar4 != (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0) {
        (pEVar9->value).resolveOp.ptr.field_1 =
             (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<void>_>_2)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)aVar4);
      }
    }
    pDVar2 = (row->value).vineInfo.ptr.disposer;
    pVVar5 = (row->value).vineInfo.ptr.ptr;
    uVar6 = *(undefined4 *)((long)&(pEVar9->value).vineInfo.ptr.disposer + 4);
    uVar7 = *(undefined4 *)&(pEVar9->value).vineInfo.ptr.ptr;
    uVar8 = *(undefined4 *)((long)&(pEVar9->value).vineInfo.ptr.ptr + 4);
    *(undefined4 *)&(row->value).vineInfo.ptr.disposer =
         *(undefined4 *)&(pEVar9->value).vineInfo.ptr.disposer;
    *(undefined4 *)((long)&(row->value).vineInfo.ptr.disposer + 4) = uVar6;
    *(undefined4 *)&(row->value).vineInfo.ptr.ptr = uVar7;
    *(undefined4 *)((long)&(row->value).vineInfo.ptr.ptr + 4) = uVar8;
    (pEVar9->value).vineInfo.ptr.ptr = (VineInfo *)0x0;
    if (pVVar5 != (VineInfo *)0x0) {
      (**pDVar2->_vptr_Disposer)();
    }
  }
  ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
  ::removeLast((ArrayBuilder<kj::HashMap<unsigned_int,_capnp::_::RpcSystemBase::RpcConnectionState::Export>::Entry>
                *)this);
  return __return_storage_ptr__;
}

Assistant:

Row Table<Row, Indexes...>::release(Row& row) {
  KJ_TABLE_IREQUIRE(&row >= rows.begin() && &row < rows.end(), "row is not a member of this table");
  size_t pos = &row - rows.begin();
  Impl<>::erase(*this, pos, row);
  Row result = kj::mv(row);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    row = kj::mv(rows[back]);
  }
  rows.removeLast();
  return result;
}